

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Connection::Connection(Connection *this,short port)

{
  int iVar1;
  hostent *phVar2;
  ssize_t sVar3;
  undefined8 extraout_RAX;
  allocator *paVar4;
  string *psVar5;
  char *pcVar6;
  string *this_00;
  sockaddr *unaff_R14;
  undefined8 uStack_f8;
  string *psStack_f0;
  string sStack_c8;
  string sStack_a8;
  string *psStack_88;
  void *pvStack_80;
  allocator local_69;
  sa_family_t local_68;
  ushort local_66;
  undefined1 local_64 [44];
  string local_38;
  
  pvStack_80 = (void *)0x111f34;
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (iVar1 < 0) {
    pcVar6 = "socket() failed";
    psVar5 = &local_38;
    paVar4 = (allocator *)&local_68;
  }
  else {
    unaff_R14 = (sockaddr *)local_64;
    local_64[8] = '\0';
    local_64[9] = '\0';
    local_64[10] = '\0';
    local_64[0xb] = '\0';
    local_64[0] = '\0';
    local_64[1] = '\0';
    local_64[2] = '\0';
    local_64[3] = '\0';
    local_64[4] = '\0';
    local_64[5] = '\0';
    local_64[6] = '\0';
    local_64[7] = '\0';
    local_68 = 2;
    local_66 = port << 8 | (ushort)port >> 8;
    pvStack_80 = (void *)0x111f64;
    phVar2 = gethostbyname("localhost");
    pvStack_80 = (void *)0x111f77;
    memcpy(unaff_R14,*phVar2->h_addr_list,(long)phVar2->h_length);
    pvStack_80 = (void *)0x111f86;
    iVar1 = connect(this->sock,(sockaddr *)&local_68,0x10);
    if (-1 < iVar1) {
      return;
    }
    pcVar6 = "connect() failed";
    psVar5 = (string *)(local_64 + 0xc);
    paVar4 = &local_69;
  }
  pvStack_80 = (void *)0x111fbf;
  std::__cxx11::string::string((string *)psVar5,pcVar6,paVar4);
  pvStack_80 = (void *)0x111fc7;
  this_00 = psVar5;
  myerror(psVar5);
  psStack_88 = psVar5;
  pvStack_80 = unaff_R14;
  sVar3 = send(*(int *)&(this_00->_M_dataplus)._M_p,*(void **)pcVar6,*(size_t *)(pcVar6 + 8),0);
  if (-1 < (int)sVar3) {
    readLine_abi_cxx11_(&sStack_c8,(Connection *)this_00);
    std::operator==(&sStack_c8,"ok");
    std::__cxx11::string::~string((string *)&sStack_c8);
    return;
  }
  pcVar6 = "Unable to send";
  std::__cxx11::string::string((string *)&sStack_a8,"Unable to send",(allocator *)&sStack_c8);
  psVar5 = &sStack_a8;
  myerror(&sStack_a8);
  uStack_f8 = extraout_RAX;
  psStack_f0 = &sStack_a8;
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar5->_M_string_length = 0;
  (psVar5->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    recv(*(int *)pcVar6,(void *)((long)&uStack_f8 + 7),1,0);
    if (uStack_f8._7_1_ == '\n') break;
    std::__cxx11::string::push_back((char)psVar5);
  }
  return;
}

Assistant:

Connection::Connection(short port) {
#if defined(__linux__) || defined(__APPLE__)
  struct sockaddr_in echoServAddr; /* Echo server address */
  struct  hostent  *ptrh;
  
  /* Create a reliable, stream socket using TCP */
  if ((sock = socket(AF_INET, SOCK_STREAM, 0)) < 0)
    myerror("socket() failed");
  
  /* Construct the server address structure */
  memset(&echoServAddr, 0, sizeof(echoServAddr));     /* Zero out structure */
  echoServAddr.sin_family      = AF_INET;             /* Internet address family */
  echoServAddr.sin_port = htons(port);                /* Server port */

  ptrh = gethostbyname("localhost");

  memcpy(&echoServAddr.sin_addr, ptrh->h_addr, ptrh->h_length);
  
  /* Establish the connection to the echo server */
  if (connect(sock, (struct sockaddr *) &echoServAddr, sizeof(echoServAddr)) < 0)
    myerror("connect() failed");
#else
		WSADATA wsaData;
    int iResult = WSAStartup(MAKEWORD(2,2), &wsaData);
    if (iResult != NO_ERROR)
				printf("Client: Error at WSAStartup().\n");

	// Create a socket.
    sock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if (sock == INVALID_SOCKET) {
        printf("Client: socket() - Error at socket(): %d\n", WSAGetLastError());
        WSACleanup();
    }

    // Connect to a server.
    sockaddr_in clientService;
    clientService.sin_family = AF_INET;
    // Just test using the localhost, you can try other IP address
    clientService.sin_addr.s_addr = inet_addr("127.0.0.1");
    clientService.sin_port = htons(port);

    if (connect(sock, (SOCKADDR*)&clientService, sizeof(clientService)) == SOCKET_ERROR) {
        printf("Client: connect() - Failed to connect.\n");
        WSACleanup();
    }
#endif
}